

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode cf_he_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  undefined4 uVar1;
  byte local_49;
  long lStack_48;
  _Bool bdone;
  eyeballer *baller;
  ulong uStack_38;
  CURLcode result;
  size_t i;
  cf_he_ctx *ctx;
  _Bool *done_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  i = (size_t)cf->ctx;
  baller._4_4_ = CURLE_OK;
  if ((cf->field_0x24 & 1) == 0) {
    ctx = (cf_he_ctx *)done;
    done_local = (_Bool *)data;
    data_local = (Curl_easy *)cf;
    for (uStack_38 = 0; uStack_38 < 2; uStack_38 = uStack_38 + 1) {
      lStack_48 = *(long *)(i + 0x20 + uStack_38 * 8);
      local_49 = 0;
      if (((lStack_48 != 0) && (*(long *)(lStack_48 + 0x28) != 0)) &&
         ((*(byte *)(lStack_48 + 100) >> 4 & 1) == 0)) {
        uVar1 = (**(code **)(**(long **)(lStack_48 + 0x28) + 0x28))
                          (*(undefined8 *)(lStack_48 + 0x28),done_local,&local_49);
        *(undefined4 *)(lStack_48 + 0x5c) = uVar1;
        if ((*(int *)(lStack_48 + 0x5c) != 0) || ((local_49 & 1) != 0)) {
          *(byte *)(lStack_48 + 100) = *(byte *)(lStack_48 + 100) & 0xef | 0x10;
        }
      }
    }
    *(undefined1 *)&ctx->transport = 1;
    for (uStack_38 = 0; uStack_38 < 2; uStack_38 = uStack_38 + 1) {
      if ((*(long *)(i + 0x20 + uStack_38 * 8) != 0) &&
         ((*(byte *)(*(long *)(i + 0x20 + uStack_38 * 8) + 100) >> 4 & 1) == 0)) {
        *(undefined1 *)&ctx->transport = 0;
      }
    }
    if ((ctx->transport & 1) != 0) {
      for (uStack_38 = 0; uStack_38 < 2; uStack_38 = uStack_38 + 1) {
        if ((*(long *)(i + 0x20 + uStack_38 * 8) != 0) &&
           (*(int *)(*(long *)(i + 0x20 + uStack_38 * 8) + 0x5c) != 0)) {
          baller._4_4_ = *(CURLcode *)(*(long *)(i + 0x20 + uStack_38 * 8) + 0x5c);
        }
      }
    }
    if ((((done_local != (_Bool *)0x0) && ((*(ulong *)(done_local + 0xa9a) >> 0x1c & 1) != 0)) &&
        ((*(long *)(done_local + 0x1328) == 0 || (0 < *(int *)(*(long *)(done_local + 0x1328) + 8)))
        )) && ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
      Curl_trc_cf_infof((Curl_easy *)done_local,(Curl_cfilter *)data_local,"shutdown -> %d, done=%d"
                        ,(ulong)baller._4_4_,(ulong)((byte)ctx->transport & 1));
    }
    cf_local._4_4_ = baller._4_4_;
  }
  else {
    *done = true;
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode cf_he_shutdown(struct Curl_cfilter *cf,
                               struct Curl_easy *data, bool *done)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* shutdown all ballers that have not done so already. If one fails,
   * continue shutting down others until all are shutdown. */
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    struct eyeballer *baller = ctx->baller[i];
    bool bdone = FALSE;
    if(!baller || !baller->cf || baller->shutdown)
      continue;
    baller->result = baller->cf->cft->do_shutdown(baller->cf, data, &bdone);
    if(baller->result || bdone)
      baller->shutdown = TRUE; /* treat a failed shutdown as done */
  }

  *done = TRUE;
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    if(ctx->baller[i] && !ctx->baller[i]->shutdown)
      *done = FALSE;
  }
  if(*done) {
    for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
      if(ctx->baller[i] && ctx->baller[i]->result)
        result = ctx->baller[i]->result;
    }
  }
  CURL_TRC_CF(data, cf, "shutdown -> %d, done=%d", result, *done);
  return result;
}